

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Config::readBazelEnvVars(Config *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  char *pcVar7;
  char *__s;
  char *__s_00;
  ostream *poVar8;
  ReporterSpec *in_RSI;
  allocator<char> local_2f9;
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions> bazelShardOptions;
  undefined4 *local_2c8 [2];
  undefined4 *local_2b8 [2];
  string local_2a8;
  undefined1 local_288 [16];
  _Base_ptr local_278;
  _Base_ptr local_270;
  _Base_ptr local_268;
  size_t local_260;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  Optional<Catch::ColourMode> local_230;
  ofstream f;
  char *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_200;
  
  pcVar7 = getenv("XML_OUTPUT_FILE");
  if (pcVar7 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"junit",(allocator<char> *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bazelShardOptions,pcVar7,(allocator<char> *)local_2c8);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Optional(&local_258,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bazelShardOptions
            );
    local_230.nullableValue = (ColourMode *)0x0;
    local_270 = (_Base_ptr)(local_288 + 8);
    local_288 = (undefined1  [16])0x0;
    local_278 = (_Base_ptr)0x0;
    local_260 = 0;
    local_268 = local_270;
    ReporterSpec::ReporterSpec
              ((ReporterSpec *)&f,&local_2a8,&local_258,&local_230,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_288);
    in_RSI = (ReporterSpec *)&f;
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>(&(this->m_data).reporterSpecifications,in_RSI);
    ReporterSpec::~ReporterSpec((ReporterSpec *)&f);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_288);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_258);
    std::__cxx11::string::~string((string *)&bazelShardOptions);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  pcVar7 = getenv("TESTBRIDGE_TEST_ONLY");
  if (pcVar7 != (char *)0x0) {
    this_00 = &(this->m_data).testsOrTags;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&f,pcVar7,(allocator<char> *)&bazelShardOptions);
    in_RSI = (ReporterSpec *)&f;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
    std::__cxx11::string::~string((string *)&f);
  }
  pcVar7 = getenv("TEST_SHARD_INDEX");
  __s = getenv("TEST_TOTAL_SHARDS");
  __s_00 = getenv("TEST_SHARD_STATUS_FILE");
  if (((pcVar7 == (char *)0x0) || (__s == (char *)0x0)) || (__s_00 == (char *)0x0)) {
    if (pcVar7 == (char *)0x0) {
      anon_unknown_26::readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)"TEST_SHARD_INDEX",(char *)in_RSI);
    }
    if (__s == (char *)0x0) {
      anon_unknown_26::readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)"TEST_TOTAL_SHARDS",(char *)in_RSI);
    }
    if (__s_00 == (char *)0x0) {
      anon_unknown_26::readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)"TEST_SHARD_STATUS_FILE",(char *)in_RSI);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&f,pcVar7,(allocator<char> *)local_2c8);
    parseUInt((Catch *)local_2b8,(string *)&f,10);
    std::__cxx11::string::~string((string *)&f);
    if (local_2b8[0] == (undefined4 *)0x0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "Warning: could not parse \'TEST_SHARD_INDEX\' (\'");
      poVar8 = std::operator<<(poVar8,pcVar7);
      std::operator<<(poVar8,"\') as unsigned int.\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&f,__s,&local_2f9);
      parseUInt((Catch *)local_2c8,(string *)&f,10);
      std::__cxx11::string::~string((string *)&f);
      if (local_2c8[0] != (undefined4 *)0x0) {
        _f = *local_2b8[0];
        uVar3 = *local_2c8[0];
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,__s_00,&local_2f9);
        uVar4 = local_210._M_allocated_capacity;
        bazelShardOptions.nullableValue = (bazelShardingOptions *)bazelShardOptions.storage;
        bazelShardOptions.storage._4_4_ = uVar3;
        bazelShardOptions.storage._0_4_ = _f;
        bazelShardOptions.storage._8_8_ = bazelShardOptions.storage + 0x18;
        if (local_218 == local_210._M_local_buf + 8) {
          bazelShardOptions.storage._32_8_ = pbStack_200;
        }
        else {
          bazelShardOptions.storage._8_8_ = local_218;
        }
        local_210._M_allocated_capacity = 0;
        uVar5 = local_210._M_allocated_capacity;
        local_210._M_local_buf[0] = (char)uVar4;
        local_210._M_local_buf[1] = SUB81(uVar4,1);
        local_210._M_local_buf[2] = SUB81(uVar4,2);
        local_210._M_local_buf[3] = SUB81(uVar4,3);
        local_210._M_local_buf[4] = SUB81(uVar4,4);
        local_210._M_local_buf[5] = SUB81(uVar4,5);
        local_210._M_local_buf[6] = SUB81(uVar4,6);
        local_210._M_local_buf[7] = SUB81(uVar4,7);
        bazelShardOptions.storage[0x10] = local_210._M_local_buf[0];
        bazelShardOptions.storage[0x11] = local_210._M_local_buf[1];
        bazelShardOptions.storage[0x12] = local_210._M_local_buf[2];
        bazelShardOptions.storage[0x13] = local_210._M_local_buf[3];
        bazelShardOptions.storage[0x14] = local_210._M_local_buf[4];
        bazelShardOptions.storage[0x15] = local_210._M_local_buf[5];
        bazelShardOptions.storage[0x16] = local_210._M_local_buf[6];
        bazelShardOptions.storage[0x17] = local_210._M_local_buf[7];
        local_210._M_local_buf[8] = '\0';
        local_218 = local_210._M_local_buf + 8;
        local_210._M_allocated_capacity = uVar5;
        std::__cxx11::string::~string((string *)&local_218);
        if (bazelShardOptions.nullableValue != (bazelShardingOptions *)0x0) {
          std::ofstream::ofstream
                    (&f,(string *)&(bazelShardOptions.nullableValue)->shardFilePath,_S_trunc|_S_out)
          ;
          cVar6 = std::__basic_file<char>::is_open();
          if (cVar6 != '\0') {
            std::operator<<((ostream *)&f,"");
            uVar1 = (bazelShardOptions.nullableValue)->shardIndex;
            uVar2 = (bazelShardOptions.nullableValue)->shardCount;
            (this->m_data).shardCount = uVar2;
            (this->m_data).shardIndex = uVar1;
          }
          std::ofstream::~ofstream(&f);
        }
        goto LAB_00132175;
      }
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "Warning: could not parse \'TEST_TOTAL_SHARD\' (\'");
      poVar8 = std::operator<<(poVar8,__s);
      std::operator<<(poVar8,"\') as unsigned int.\n");
    }
  }
  bazelShardOptions.nullableValue = (bazelShardingOptions *)0x0;
LAB_00132175:
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::~Optional(&bazelShardOptions);
  return;
}

Assistant:

void Config::readBazelEnvVars() {
        // Register a JUnit reporter for Bazel. Bazel sets an environment
        // variable with the path to XML output. If this file is written to
        // during test, Bazel will not generate a default XML output.
        // This allows the XML output file to contain higher level of detail
        // than what is possible otherwise.
        const auto bazelOutputFile = Detail::getEnv( "XML_OUTPUT_FILE" );

        if ( bazelOutputFile ) {
            m_data.reporterSpecifications.push_back(
                { "junit", std::string( bazelOutputFile ), {}, {} } );
        }

        const auto bazelTestSpec = Detail::getEnv( "TESTBRIDGE_TEST_ONLY" );
        if ( bazelTestSpec ) {
            // Presumably the test spec from environment should overwrite
            // the one we got from CLI (if we got any)
            m_data.testsOrTags.clear();
            m_data.testsOrTags.push_back( bazelTestSpec );
        }

        const auto bazelShardOptions = readBazelShardingOptions();
        if ( bazelShardOptions ) {
            std::ofstream f( bazelShardOptions->shardFilePath,
                             std::ios_base::out | std::ios_base::trunc );
            if ( f.is_open() ) {
                f << "";
                m_data.shardIndex = bazelShardOptions->shardIndex;
                m_data.shardCount = bazelShardOptions->shardCount;
            }
        }
    }